

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **argv)

{
  istream *this;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  int nt;
  int nx;
  double local_6a8;
  string timing_file_name;
  string output_file_name;
  string input_file_name;
  fstream input_file;
  fstream timing_file;
  fstream output_file;
  
  std::ios_base::sync_with_stdio(false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input_file_name,argv[1],(allocator<char> *)&input_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_file_name,argv[2],(allocator<char> *)&input_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&timing_file_name,argv[3],(allocator<char> *)&input_file);
  std::fstream::fstream(&input_file,(string *)&input_file_name,_S_in);
  this = (istream *)std::istream::operator>>((istream *)&input_file,&nx);
  std::istream::operator>>(this,&nt);
  lVar1 = std::chrono::_V2::system_clock::now();
  local_6a8 = solve_problem(nx,nt);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::fstream::fstream(&output_file,(string *)&output_file_name,_S_out);
  poVar3 = std::ostream::_M_insert<double>(local_6a8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::fstream::fstream(&timing_file,(string *)&timing_file_name,_S_out);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::fstream::~fstream(&timing_file);
  std::fstream::~fstream(&output_file);
  std::fstream::~fstream(&input_file);
  std::__cxx11::string::~string((string *)&timing_file_name);
  std::__cxx11::string::~string((string *)&output_file_name);
  std::__cxx11::string::~string((string *)&input_file_name);
  return 0;
}

Assistant:

int main(int, char** argv)
{
    std::ios_base::sync_with_stdio(false);

    std::string input_file_name(argv[1]);
    std::string output_file_name(argv[2]);
    std::string timing_file_name(argv[3]);

    std::fstream input_file(input_file_name, std::ios::in);
    int nx, nt;
    input_file >> nx >> nt;

    auto start_time = std::chrono::high_resolution_clock::now();
    double error = solve_problem(nx, nt);
    auto end_time = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double> elapsed_time = end_time - start_time;

    std::fstream output_file(output_file_name, std::ios::out);
    output_file << error << std::endl;

    std::fstream timing_file(timing_file_name, std::ios::out);
    timing_file << elapsed_time.count() << std::endl;

    return 0;
}